

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall FastPForLib::BitWidthHistoGram::display(BitWidthHistoGram *this,string *prefix)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  size_t k_1;
  ulong uVar4;
  double dVar5;
  
  pdVar2 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = 0.0;
  for (lVar3 = 0; (long)pdVar2 - (long)pdVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    dVar5 = dVar5 + pdVar1[lVar3];
  }
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    for (uVar4 = 0; uVar4 < (ulong)((long)pdVar2 - (long)pdVar1 >> 3); uVar4 = uVar4 + 1) {
      printf("%s%zu %f\n",pdVar1[uVar4] / dVar5,(prefix->_M_dataplus)._M_p,uVar4);
      pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void display(std::string prefix = "") {
    double sum = 0;
    for (size_t k = 0; k < histo.size(); ++k)
      sum += histo[k];
    if (sum == 0)
      return;
    for (size_t k = 0; k < histo.size(); ++k) {
      printf("%s%zu %f\n", prefix.c_str(), k, histo[k] / sum);
    }
  }